

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

static_huffman_data_model * __thiscall
crnd::static_huffman_data_model::operator=
          (static_huffman_data_model *this,static_huffman_data_model *rhs)

{
  decoder_tables *p;
  decoder_tables *pdVar1;
  
  if (this != rhs) {
    this->m_total_syms = rhs->m_total_syms;
    vector<unsigned_char>::assign(&this->m_code_sizes,&rhs->m_code_sizes);
    if ((this->m_code_sizes).m_alloc_failed == true) {
      clear(this);
    }
    else {
      pdVar1 = rhs->m_pDecode_tables;
      p = this->m_pDecode_tables;
      if (pdVar1 == (decoder_tables *)0x0) {
        crnd_delete<crnd::prefix_coding::decoder_tables>(p);
        this->m_pDecode_tables = (decoder_tables *)0x0;
      }
      else if (p == (decoder_tables *)0x0) {
        pdVar1 = crnd_new<crnd::prefix_coding::decoder_tables>(pdVar1);
        this->m_pDecode_tables = pdVar1;
      }
      else {
        prefix_coding::decoder_tables::operator=(p,pdVar1);
      }
    }
  }
  return this;
}

Assistant:

static_huffman_data_model& static_huffman_data_model::operator=(const static_huffman_data_model& rhs)
    {
        if (this == &rhs)
            return *this;

        m_total_syms = rhs.m_total_syms;
        m_code_sizes = rhs.m_code_sizes;
        if (m_code_sizes.get_alloc_failed())
        {
            clear();
            return *this;
        }

        if (rhs.m_pDecode_tables)
        {
            if (m_pDecode_tables)
                *m_pDecode_tables = *rhs.m_pDecode_tables;
            else
                m_pDecode_tables = crnd_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
        }
        else
        {
            crnd_delete(m_pDecode_tables);
            m_pDecode_tables = NULL;
        }

        return *this;
    }